

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

void __thiscall Args::CmdLine::~CmdLine(CmdLine *this)

{
  CmdLine *in_RDI;
  
  ~CmdLine(in_RDI);
  operator_delete(in_RDI,0xb8);
  return;
}

Assistant:

virtual ~CmdLine()
	{
	}